

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::BrickGravity::Evaluate
          (BrickGravity *this,ChVectorN<double,_8> *result,double x,double y,double z)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  double dVar4;
  Scalar SVar5;
  double y_00;
  Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>
  local_c0;
  ShapeVector *local_b0;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true> local_a8;
  ChMatrixNM<double,_3,_3> rd0;
  
  dVar4 = x;
  ChElementHexaANCF_3813::ShapeFunctions((ChElementHexaANCF_3813 *)this,&this->N,x,y,z);
  y_00 = y;
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeX(this->element,&this->Nx,dVar4,y,z);
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeY(this->element,&this->Ny,x,y_00,z);
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeZ(this->element,&this->Nz,x,y,z);
  dVar4 = (this->element->m_InertFlexVec).m_data[0];
  local_c0.m_lhs.m_matrix = this->d0;
  auVar2._8_8_ = 0x3fe0000000000000;
  auVar2._0_8_ = 0x3fe0000000000000;
  auVar2 = vmulpd_avx512vl(*(undefined1 (*) [16])((this->element->m_InertFlexVec).m_data + 1),auVar2
                          );
  local_c0.m_rhs.m_matrix = &this->Nx;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_a8,&rd0,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)&local_a8,&local_c0);
  local_c0.m_lhs.m_matrix = this->d0;
  local_c0.m_rhs.m_matrix = &this->Ny;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_a8,&rd0,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)&local_a8,&local_c0);
  local_c0.m_lhs.m_matrix = this->d0;
  local_c0.m_rhs.m_matrix = &this->Nz;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false,_true>::
  BlockImpl_dense(&local_a8,&rd0,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            ((Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3,_1,_false> *)&local_a8,&local_c0);
  SVar5 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run(&rd0);
  auVar1 = vshufpd_avx(auVar2,auVar2,1);
  local_c0.m_lhs.m_matrix = (non_const_type)(auVar1._0_8_ * auVar2._0_8_ * SVar5 * dVar4 * 0.5);
  local_b0 = &this->N;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
                    *)&local_a8,(double *)&local_c0,(StorageBaseType *)&local_b0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_a8.m_xpr;
  auVar3 = vbroadcastsd_avx512f(auVar1);
  auVar3 = vmulpd_avx512f(auVar3,*(undefined1 (*) [64])local_a8.m_startRow.m_value);
  *(undefined1 (*) [64])
   (result->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.array =
       auVar3;
  return;
}

Assistant:

void BrickGravity::Evaluate(ChVectorN<double, 8>& result, const double x, const double y, const double z) {
    element->ShapeFunctions(N, x, y, z);
    element->ShapeFunctionsDerivativeX(Nx, x, y, z);
    element->ShapeFunctionsDerivativeY(Ny, x, y, z);
    element->ShapeFunctionsDerivativeZ(Nz, x, y, z);

    // Weights for Gaussian integration
    double wx2 = (element->GetLengthX()) / 2;
    double wy2 = (element->GetLengthY()) / 2;
    double wz2 = (element->GetLengthZ()) / 2;

    ChMatrixNM<double, 3, 3> rd0;
    rd0.col(0) = (*d0).transpose() * Nx.transpose();
    rd0.col(1) = (*d0).transpose() * Ny.transpose();
    rd0.col(2) = (*d0).transpose() * Nz.transpose();
    double detJ0 = rd0.determinant();

    result = detJ0 * wx2 * wy2 * wz2 * N.transpose();
}